

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDateTime QDateTime::fromString(QStringView string,DateFormat format)

{
  bool bVar1;
  int d;
  int y;
  int iVar2;
  QTime QVar3;
  QDate date;
  long lVar4;
  DateFormat in_ECX;
  undefined4 in_register_00000014;
  storage_type_conflict *psVar5;
  Data DVar6;
  storage_type_conflict *psVar7;
  Data d_00;
  Data *this;
  Data DVar8;
  long in_FS_OFFSET;
  QStringView string_00;
  QLatin1StringView s;
  QLatin1StringView s_00;
  ParsedRfcDateTime PVar9;
  QStringView s_01;
  QStringView string_01;
  QStringView offsetString;
  QStringView string_02;
  QStringView offsetString_00;
  int local_138;
  Data local_130;
  Data local_128;
  storage_type_conflict *psStack_120;
  bool isMidnight24;
  undefined7 uStack_117;
  bool ok_1;
  iterator it;
  Data local_d0;
  storage_type_conflict *local_c8;
  storage_type_conflict *local_c0;
  undefined8 local_b8;
  Data local_b0;
  storage_type_conflict *local_a8;
  undefined1 **local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  psVar5 = (storage_type_conflict *)CONCAT44(in_register_00000014,format);
  psVar7 = string.m_data;
  d_00 = (Data)string.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (psVar7 == (storage_type_conflict *)0x0) goto switchD_00310c60_caseD_2;
  switch(in_ECX) {
  case TextDate:
    local_138 = 3;
    local_a0 = &local_98;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = (Data)0x6;
    local_a8 = (storage_type_conflict *)0x0;
    local_d0.d = (QTimeZonePrivate *)0x100000001;
    local_b8 = 0xaaaaaaaaaaaa0020;
    it.current.state.extra = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    it.current.state.start = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    it.current.state.end = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    it.current.value.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    it.current._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    it.tokenizer = (QStringTokenizerBase<QStringView,_QChar> *)&DAT_aaaaaaaaaaaaaaaa;
    it.current.value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8 = psVar7;
    local_c0 = psVar5;
    QStringTokenizerBase<QStringView,_QChar>::iterator::iterator
              (&it,(QStringTokenizerBase<QStringView,_QChar> *)&local_d0.s);
    iVar2 = 6;
    while( true ) {
      bVar1 = iVar2 == 0;
      iVar2 = iVar2 + -1;
      if ((bVar1) || (it.current.ok == false)) break;
      QVarLengthArray<QStringView,6ll>::emplace_back<QStringView_const&>
                ((QVarLengthArray<QStringView,6ll> *)&local_b0.s,&it.current.value);
      QStringTokenizerBase<QStringView,_QChar>::iterator::advance(&it);
    }
    if (((long)local_a8 < 5) || (it.current.ok == true)) {
LAB_00310e49:
      QDateTime((QDateTime *)d_00.d);
    }
    else {
      bVar1 = QStringView::contains((QStringView *)(local_a0 + 6),(QChar)0x3a,CaseSensitive);
      if (bVar1) {
        iVar2 = 4;
      }
      else {
        bVar1 = QStringView::contains((QStringView *)(local_a0 + 8),(QChar)0x3a,CaseSensitive);
        if (!bVar1) goto LAB_00310e49;
        iVar2 = 3;
        local_138 = 4;
      }
      ok_1 = false;
      d = QStringView::toInt((QStringView *)(local_a0 + 4),&ok_1,10);
      y = 0;
      if (ok_1 == true) {
        y = QStringView::toInt((QStringView *)((ulong)(uint)(iVar2 << 4) + (long)local_a0),&ok_1,10)
        ;
      }
      iVar2 = fromShortMonthName(*(QStringView *)(local_a0 + 2));
      if ((((iVar2 < 1) || (d == 0)) || (y == 0)) || (ok_1 == false)) goto LAB_00310e49;
      _isMidnight24 = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      QDate::QDate((QDate *)&isMidnight24,y,iVar2,d);
      if (((undefined1 *)0x16d3e147973 < (undefined1 *)(_isMidnight24 + 0xb69eeff91f)) ||
         (string_01.m_data =
               *(storage_type_conflict **)((long)local_a0 + (ulong)(uint)(local_138 << 4) + 8),
         string_01.m_size = *(qsizetype *)((long)local_a0 + (ulong)(uint)(local_138 << 4)),
         QVar3 = fromIsoTimeString(string_01,TextDate,(bool *)0x0), 86399999 < (uint)QVar3.mds))
      goto LAB_00310e49;
      if (local_a8 == (storage_type_conflict *)0x5) {
        QDateTime((QDateTime *)d_00.d,_isMidnight24,QVar3,LegacyBehavior);
      }
      else {
        local_128 = (Data)((Data *)(local_a0 + 10))->d;
        psStack_120 = (storage_type_conflict *)local_a0[0xb];
        s.m_data = "UTC";
        s.m_size = 3;
        bVar1 = QStringView::startsWith((QStringView *)&local_128.s,s,CaseSensitive);
        if ((!bVar1) &&
           (s_00.m_data = "GMT", s_00.m_size = 3,
           bVar1 = QStringView::startsWith((QStringView *)&local_128.s,s_00,CaseInsensitive), !bVar1
           )) goto LAB_00310e49;
        offsetString_00.m_data = psStack_120 + 3;
        offsetString_00.m_size = (QTimeZonePrivate *)((long)&local_128.d[-1].m_id.d.size + 5);
        local_128.d = offsetString_00.m_size;
        psStack_120 = offsetString_00.m_data;
        if (offsetString_00.m_size == (QTimeZonePrivate *)0x0) {
          local_130 = (Data)0x2;
          QDateTime((QDateTime *)d_00.d,_isMidnight24,QVar3,(QTimeZone *)&local_130.s,LegacyBehavior
                   );
        }
        else {
          iVar2 = fromOffsetString(offsetString_00,&ok_1);
          if (ok_1 != true) goto LAB_00310e49;
          local_130.d = (QTimeZonePrivate *)0x0;
          if ((long)iVar2 + 0xe100U < 0x1c201) {
            local_130.d = (QTimeZonePrivate *)((3 - (ulong)(iVar2 == 0)) + (long)iVar2 * 4);
          }
          QDateTime((QDateTime *)d_00.d,_isMidnight24,QVar3,(QTimeZone *)&local_130.s,LegacyBehavior
                   );
        }
        QTimeZone::~QTimeZone((QTimeZone *)&local_130.s);
      }
    }
    QVarLengthArray<QStringView,_6LL>::~QVarLengthArray
              ((QVarLengthArray<QStringView,_6LL> *)&local_b0.s);
    break;
  case ISODate:
  case ISODateWithMs:
    if ((int)string.m_data < 10) goto switchD_00310c60_caseD_2;
    string_00.m_data = (storage_type_conflict *)0x1;
    string_00.m_size = (qsizetype)psVar5;
    date = QDate::fromString((QDate *)0xa,string_00,3);
    it.tokenizer = (QStringTokenizerBase<QStringView,_QChar> *)date;
    if (date.jd + 0xb69eeff91fU < 0x16d3e147974) {
      if ((int)string.m_data != 10) {
        local_d0 = (Data)0x1;
        local_a8 = psVar5 + 10;
        local_b0.d = (QTimeZonePrivate *)(psVar7 + -5);
        if (((long)psVar7 < 0xc) ||
           ((bVar1 = QStringView::startsWith((QStringView *)&local_b0.s,(QChar)0x54,CaseInsensitive)
            , !bVar1 && ((local_b0.d == (QTimeZonePrivate *)0x0 || (*local_a8 != L' ')))))) {
LAB_003111b6:
          QDateTime((QDateTime *)d_00.d);
        }
        else {
          local_a8 = local_a8 + 1;
          local_b0.d = (QTimeZonePrivate *)((long)&local_b0.d[-1].m_id.d.size + 7);
          bVar1 = QStringView::endsWith((QStringView *)&local_b0.s,(QChar)0x5a,CaseInsensitive);
          DVar8 = local_d0;
          if (bVar1) {
            local_d0 = (Data)0x2;
            local_128 = DVar8;
            QTimeZone::~QTimeZone((QTimeZone *)&local_128.s);
            local_b0.d = (QTimeZonePrivate *)((long)&local_b0.d[-1].m_id.d.size + 7);
          }
          else {
            DVar8 = (Data)(long)(local_b0._0_4_ + -1);
            psVar5 = local_a8 + (long)DVar8;
            iVar2 = 0;
            do {
              if ((*psVar5 == L'+') || (*psVar5 == L'-')) {
                isMidnight24 = true;
                offsetString.m_size = (long)local_b0.d - (long)DVar8;
                offsetString.m_data = psVar5;
                iVar2 = fromOffsetString(offsetString,&isMidnight24);
                if (isMidnight24 != true) goto LAB_003111b6;
                DVar6.d = (QTimeZonePrivate *)0x0;
                if ((long)iVar2 + 0xe100U < 0x1c201) {
                  DVar6.d = (QTimeZonePrivate *)((3 - (ulong)(iVar2 == 0)) + (long)iVar2 * 4);
                }
                local_128 = local_d0;
                local_d0 = DVar6;
                local_b0 = DVar8;
                QTimeZone::~QTimeZone((QTimeZone *)&local_128.s);
                break;
              }
              psVar5 = psVar5 + -1;
              DVar8.d = (QTimeZonePrivate *)((long)&DVar8.d[-1].m_id.d.size + 7);
              iVar2 = iVar2 + -1;
            } while (0 < iVar2 + local_b0._0_4_);
          }
          _isMidnight24 = _isMidnight24 & 0xffffffffffffff00;
          string_02.m_data = local_a8;
          string_02.m_size = (qsizetype)local_b0.d;
          QVar3 = fromIsoTimeString(string_02,in_ECX,&isMidnight24);
          if (86399999 < (uint)QVar3.mds) goto LAB_003111b6;
          if (isMidnight24 == true) {
            local_128 = (Data)0x8000000000000000;
            if (0xfffffe92c1eb868c < date.jd - 0xb69f248054U) {
              local_128.d = (QTimeZonePrivate *)(date.jd + 1);
            }
            QDate::startOfDay((QDate *)d_00.d,(QTimeZone *)&local_128.s);
          }
          else {
            QDateTime((QDateTime *)d_00.d,date,QVar3,(QTimeZone *)&local_d0.s,LegacyBehavior);
          }
        }
        this = &local_d0;
        goto LAB_003111c3;
      }
      QDate::startOfDay((QDate *)d_00.d);
    }
    else {
      QDateTime((QDateTime *)d_00.d);
    }
    break;
  default:
    goto switchD_00310c60_caseD_2;
  case RFC2822Date:
    s_01.m_data = psVar5;
    s_01.m_size = (qsizetype)psVar7;
    PVar9 = rfcDateImpl(s_01);
    if ((PVar9.date.jd.jd + 0xb69eeff91fU < 0x16d3e147974) && ((uint)PVar9.time.mds.mds < 86400000))
    {
      *(undefined1 **)d_00.d = &DAT_aaaaaaaaaaaaaaaa;
      local_b0 = (Data)0x2;
      QDateTime((QDateTime *)d_00.d,PVar9.date.jd,PVar9.time.mds,(QTimeZone *)&local_b0.s,
                LegacyBehavior);
      QTimeZone::~QTimeZone((QTimeZone *)&local_b0.s);
      lVar4 = (long)PVar9._8_8_ >> 0x20;
      local_b0.d = (QTimeZonePrivate *)0x0;
      if (lVar4 + 0xe100U < 0x1c201) {
        local_b0.d = (QTimeZonePrivate *)((3 - (ulong)(PVar9._8_8_ >> 0x20 == 0)) + lVar4 * 4);
      }
      reviseTimeZone((QDateTimeData *)d_00.d,(QTimeZone *)&local_b0.s,LegacyBehavior);
      this = &local_b0;
LAB_003111c3:
      QTimeZone::~QTimeZone((QTimeZone *)&this->s);
      break;
    }
    goto switchD_00310c60_caseD_2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDateTime)d_00;
  }
LAB_003113a1:
  __stack_chk_fail();
switchD_00310c60_caseD_2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QDateTime((QDateTime *)d_00.d);
    return (QDateTime)(QDateTimePrivate *)d_00;
  }
  goto LAB_003113a1;
}

Assistant:

QDateTime QDateTime::fromString(QStringView string, Qt::DateFormat format)
{
    if (string.isEmpty())
        return QDateTime();

    switch (format) {
    case Qt::RFC2822Date: {
        const ParsedRfcDateTime rfc = rfcDateImpl(string);

        if (!rfc.date.isValid() || !rfc.time.isValid())
            return QDateTime();

        QDateTime dateTime(rfc.date, rfc.time, QTimeZone::UTC);
        dateTime.setTimeZone(QTimeZone::fromSecondsAheadOfUtc(rfc.utcOffset));
        return dateTime;
    }
    case Qt::ISODate:
    case Qt::ISODateWithMs: {
        const int size = string.size();
        if (size < 10)
            return QDateTime();

        QDate date = QDate::fromString(string.first(10), Qt::ISODate);
        if (!date.isValid())
            return QDateTime();
        if (size == 10)
            return date.startOfDay();

        QTimeZone zone = QTimeZone::LocalTime;
        QStringView isoString = string.sliced(10); // trim "yyyy-MM-dd"

        // Must be left with T (or space) and at least one digit for the hour:
        if (isoString.size() < 2
            || !(isoString.startsWith(u'T', Qt::CaseInsensitive)
                 // RFC 3339 (section 5.6) allows a space here.  (It actually
                 // allows any separator one considers more readable, merely
                 // giving space as an example - but let's not go wild !)
                 || isoString.startsWith(u' '))) {
            return QDateTime();
        }
        isoString = isoString.sliced(1); // trim 'T' (or space)

        // Check end of string for Time Zone definition, either Z for UTC or ±HH:mm for Offset
        if (isoString.endsWith(u'Z', Qt::CaseInsensitive)) {
            zone = QTimeZone::UTC;
            isoString.chop(1); // trim 'Z'
        } else {
            // the loop below is faster but functionally equal to:
            // const int signIndex = isoString.indexOf(QRegulargExpression(QStringLiteral("[+-]")));
            int signIndex = isoString.size() - 1;
            Q_ASSERT(signIndex >= 0);
            bool found = false;
            do {
                QChar character(isoString[signIndex]);
                found = character == u'+' || character == u'-';
            } while (!found && --signIndex >= 0);

            if (found) {
                bool ok;
                int offset = fromOffsetString(isoString.sliced(signIndex), &ok);
                if (!ok)
                    return QDateTime();
                isoString = isoString.first(signIndex);
                zone = QTimeZone::fromSecondsAheadOfUtc(offset);
            }
        }

        // Might be end of day (24:00, including variants), which QTime considers invalid.
        // ISO 8601 (section 4.2.3) says that 24:00 is equivalent to 00:00 the next day.
        bool isMidnight24 = false;
        QTime time = fromIsoTimeString(isoString, format, &isMidnight24);
        if (!time.isValid())
            return QDateTime();
        if (isMidnight24) // time is 0:0, but we want the start of next day:
            return date.addDays(1).startOfDay(zone);
        return QDateTime(date, time, zone);
    }
    case Qt::TextDate: {
        QVarLengthArray<QStringView, 6> parts;

        auto tokens = string.tokenize(u' ', Qt::SkipEmptyParts);
        auto it = tokens.begin();
        for (int i = 0; i < 6 && it != tokens.end(); ++i, ++it)
            parts.emplace_back(*it);

        // Documented as "ddd MMM d HH:mm:ss yyyy" with optional offset-suffix;
        // and allow time either before or after year.
        if (parts.size() < 5 || it != tokens.end())
            return QDateTime();

        // Year and time can be in either order.
        // Guess which by looking for ':' in the time
        int yearPart = 3;
        int timePart = 3;
        if (parts.at(3).contains(u':'))
            yearPart = 4;
        else if (parts.at(4).contains(u':'))
            timePart = 4;
        else
            return QDateTime();

        bool ok = false;
        int day = parts.at(2).toInt(&ok);
        int year = ok ? parts.at(yearPart).toInt(&ok) : 0;
        int month = fromShortMonthName(parts.at(1));
        if (!ok || year == 0 || day == 0 || month < 1)
            return QDateTime();

        const QDate date(year, month, day);
        if (!date.isValid())
            return QDateTime();

        const QTime time = fromIsoTimeString(parts.at(timePart), format, nullptr);
        if (!time.isValid())
            return QDateTime();

        if (parts.size() == 5)
            return QDateTime(date, time);

        QStringView tz = parts.at(5);
        if (tz.startsWith("UTC"_L1)
            // GMT has long been deprecated as an alias for UTC.
            || tz.startsWith("GMT"_L1, Qt::CaseInsensitive)) {
            tz = tz.sliced(3);
            if (tz.isEmpty())
                return QDateTime(date, time, QTimeZone::UTC);

            int offset = fromOffsetString(tz, &ok);
            return ok ? QDateTime(date, time, QTimeZone::fromSecondsAheadOfUtc(offset))
                      : QDateTime();
        }
        return QDateTime();
    }
    }

    return QDateTime();
}